

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  PromiseBase PVar2;
  void *pvVar3;
  int __flags;
  _Elt_pointer pOVar4;
  StringPtr *params;
  void *__child_stack;
  _Map_pointer __arg;
  SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6509:15)>
  *location_01;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6509:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  void *continuationTracePtr;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1c0;
  OwnPromiseNode local_1b8;
  undefined1 local_1b0 [24];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_198;
  code *local_190;
  Array<char> local_188;
  char *local_170;
  _Elt_pointer pOStack_168;
  _Map_pointer local_160;
  char local_158 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_150;
  _Elt_pointer local_148;
  _Map_pointer local_140;
  undefined1 local_138 [8];
  PromiseBase PStack_130;
  OwnPromiseNode local_128;
  size_t local_120;
  _Elt_pointer pOStack_118;
  HttpHeaders local_110;
  bool local_b0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_a8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_98;
  HttpHeaders local_90;
  
  __arg = (_Map_pointer)url.content.size_;
  pOVar4 = (_Elt_pointer)url.content.ptr;
  local_148 = pOVar4;
  local_140 = __arg;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    this->concurrentRequests = this->concurrentRequests + 1;
    local_158[0] = (expectedBodySize->ptr).isSet;
    if ((bool)local_158[0] == true) {
      local_150 = (expectedBodySize->ptr).field_1;
    }
    local_90.table = (HttpHeaderTable *)this;
    (**this->inner->_vptr_HttpClient)
              (local_138,this->inner,(ulong)method,pOVar4,__arg,headers,local_158);
    fireCountChanged(this);
    attachCounter((ConcurrencyLimitingHttpClient *)local_1b0,
                  (Promise<kj::HttpClient::Response> *)&local_128,(ConnectionCounter *)&local_90);
    PVar2.node.ptr = (OwnPromiseNode)(OwnPromiseNode)PStack_130;
    PStack_130.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    (__return_storage_ptr__->body).disposer = (Disposer *)local_138;
    (__return_storage_ptr__->body).ptr = (AsyncOutputStream *)PVar2.node.ptr;
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr = (PromiseNode *)local_1b0._0_8_;
    local_1b0._0_8_ = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1b0);
    HttpClient::Request::~Request((Request *)local_138);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_90);
  }
  else {
    location.function = (char *)in_stack_fffffffffffffe30;
    location.fileName = (char *)in_stack_fffffffffffffe28;
    location._16_8_ = in_stack_fffffffffffffe38;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_1b0,location);
    __flags = (int)pOVar4;
    str<kj::StringPtr&>((String *)&local_188,(kj *)&local_148,params);
    HttpHeaders::clone(&local_90,(__fn *)headers,__child_stack,__flags,__arg);
    PStack_130.node.ptr._0_4_ = method;
    local_128.ptr = (PromiseNode *)local_188.ptr;
    local_120 = local_188.size_;
    pOStack_118 = (_Elt_pointer)local_188.disposer;
    local_188.ptr = (char *)0x0;
    local_188.size_ = 0;
    local_138 = (undefined1  [8])this;
    HttpHeaders::HttpHeaders(&local_110,&local_90);
    local_b0 = (expectedBodySize->ptr).isSet;
    if (local_b0 == true) {
      local_a8 = (expectedBodySize->ptr).field_1;
    }
    local_190 = kj::_::
                SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6509:15)>
                ::anon_class_152_5_1d7fcda0_for_func::operator();
    pPVar1 = *(PromiseArena **)(local_1b0._0_8_ + 8);
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_1b0._0_8_ - (long)pPVar1) < 0xb8) {
      pvVar3 = operator_new(0x400);
      location_01 = (SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6509:15)>
                     *)((long)pvVar3 + 0x348);
      ctor<kj::_::SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1b0,
                 (anon_class_152_5_1d7fcda0_for_func *)local_138,&local_190);
      *(void **)((long)pvVar3 + 0x350) = pvVar3;
    }
    else {
      *(PromiseArena **)(local_1b0._0_8_ + 8) = (PromiseArena *)0x0;
      location_01 = (SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6509:15)>
                     *)(local_1b0._0_8_ + -0xb8);
      ctor<kj::_::SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1b0,
                 (anon_class_152_5_1d7fcda0_for_func *)local_138,&local_190);
      (((PromiseNode *)(local_1b0._0_8_ + -0xb0))->super_PromiseArenaMember).
      _vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_198.ptr = (PromiseNode *)0x0;
    local_98.ptr = (PromiseNode *)0x0;
    local_1c0.ptr = (PromiseNode *)location_01;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_98);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_198);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)local_138);
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pOStack_168 = (_Elt_pointer)0x4d4fd8;
    local_160 = (_Map_pointer)0x1200001975;
    location_00.function = "request";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location_00.lineNumber = 0x1975;
    location_00.columnNumber = 0x12;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)local_138,location_00);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this->pendingRequests,(value_type *)(local_1b0 + 8));
    fireCountChanged(this);
    local_1b8.ptr = (PromiseNode *)local_138;
    local_138 = (undefined1  [8])0x0;
    newPromisedStream((kj *)__return_storage_ptr__,
                      (Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)&local_1b8);
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr =
         (PromiseNode *)PStack_130.node.ptr;
    PStack_130.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1b8);
    kj::_::
    TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
    ::~TupleImpl((TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
                  *)local_138);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c0);
    HttpHeaders::~HttpHeaders(&local_90);
    Array<char>::~Array(&local_188);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { newPromisedStream(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }